

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_util.cc
# Opt level: O2

int raptor_sockaddr_to_string(char **out,raptor_resolved_address *resolved_addr,int normalize)

{
  ushort uVar1;
  int iVar2;
  UniquePtr<char> UVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  uint uVar7;
  ushort uVar8;
  raptor_sockaddr_in *addr4;
  UniquePtr<char> tmp_out;
  char *host_with_scope;
  char ntop_buf [46];
  raptor_resolved_address addr_normalized;
  
  piVar5 = __errno_location();
  iVar2 = *piVar5;
  *out = (char *)0x0;
  if (normalize != 0) {
    iVar4 = raptor_sockaddr_is_v4mapped(resolved_addr,&addr_normalized);
    if (iVar4 != 0) {
      resolved_addr = &addr_normalized;
    }
  }
  uVar1 = *(ushort *)resolved_addr->addr;
  if (uVar1 == 10) {
    pcVar6 = resolved_addr->addr + 8;
    uVar8 = *(ushort *)(resolved_addr->addr + 2) << 8 | *(ushort *)(resolved_addr->addr + 2) >> 8;
    uVar7 = *(uint *)(resolved_addr->addr + 0x18);
LAB_0010d078:
    pcVar6 = inet_ntop((uint)uVar1,pcVar6,ntop_buf,0x2e);
    if (pcVar6 != (char *)0x0) {
      tmp_out._M_t.super___uniq_ptr_impl<char,_raptor::DefaultDeleteChar>._M_t.
      super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.super__Head_base<0UL,_char_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<char,_raptor::DefaultDeleteChar,_true,_true>)
           (__uniq_ptr_impl<char,_raptor::DefaultDeleteChar>)0x0;
      if (uVar7 == 0) {
        iVar4 = raptor::JoinHostPort(&tmp_out,ntop_buf,(uint)uVar8);
      }
      else {
        raptor_asprintf(&host_with_scope,"%s%%25%u",ntop_buf,(ulong)uVar7);
        iVar4 = raptor::JoinHostPort(&tmp_out,host_with_scope,(uint)uVar8);
        raptor::Free(host_with_scope);
      }
      UVar3._M_t.super___uniq_ptr_impl<char,_raptor::DefaultDeleteChar>._M_t.
      super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.super__Head_base<0UL,_char_*,_false>
      ._M_head_impl =
           tmp_out._M_t.super___uniq_ptr_impl<char,_raptor::DefaultDeleteChar>._M_t.
           super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
      tmp_out._M_t.super___uniq_ptr_impl<char,_raptor::DefaultDeleteChar>._M_t.
      super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.super__Head_base<0UL,_char_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<char,_raptor::DefaultDeleteChar,_true,_true>)
           (__uniq_ptr_impl<char,_raptor::DefaultDeleteChar>)0x0;
      *out = (char *)UVar3._M_t.super___uniq_ptr_impl<char,_raptor::DefaultDeleteChar>._M_t.
                     super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl;
      std::unique_ptr<char,_raptor::DefaultDeleteChar>::~unique_ptr(&tmp_out);
      goto LAB_0010d10f;
    }
    uVar1 = *(ushort *)resolved_addr->addr;
  }
  else if (uVar1 == 2) {
    pcVar6 = resolved_addr->addr + 4;
    uVar8 = *(ushort *)(resolved_addr->addr + 2) << 8 | *(ushort *)(resolved_addr->addr + 2) >> 8;
    uVar7 = 0;
    goto LAB_0010d078;
  }
  iVar4 = raptor_asprintf(out,"(sockaddr family=%d)",(ulong)uVar1);
LAB_0010d10f:
  *piVar5 = iVar2;
  return iVar4;
}

Assistant:

int raptor_sockaddr_to_string(char** out,
                              const raptor_resolved_address* resolved_addr,
                              int normalize) {
    const raptor_sockaddr* addr;
    const int save_errno = errno;
    raptor_resolved_address addr_normalized;
    char ntop_buf[INET6_ADDRSTRLEN];
    const void* ip = nullptr;
    int port = 0;
    uint32_t sin6_scope_id = 0;
    int ret;

    *out = nullptr;
    if (normalize && raptor_sockaddr_is_v4mapped(resolved_addr, &addr_normalized)) {
        resolved_addr = &addr_normalized;
    }
    addr = reinterpret_cast<const raptor_sockaddr*>(resolved_addr->addr);
    if (addr->sa_family == AF_INET) {
        const raptor_sockaddr_in* addr4 =
            reinterpret_cast<const raptor_sockaddr_in*>(addr);
        ip = &addr4->sin_addr;
        port = ntohs(addr4->sin_port);
    } else if (addr->sa_family == AF_INET6) {
        const raptor_sockaddr_in6* addr6 =
            reinterpret_cast<const raptor_sockaddr_in6*>(addr);
        ip = &addr6->sin6_addr;
        port = ntohs(addr6->sin6_port);
        sin6_scope_id = addr6->sin6_scope_id;
    }
    if (ip != nullptr && raptor_inet_ntop(addr->sa_family, ip, ntop_buf,
                                        sizeof(ntop_buf)) != nullptr) {
        raptor::UniquePtr<char> tmp_out;
        if (sin6_scope_id != 0) {
            char* host_with_scope;
            /* Enclose sin6_scope_id with the format defined in RFC 6784 section 2. */
            raptor_asprintf(&host_with_scope, "%s%%25%u", ntop_buf, sin6_scope_id);
            ret = raptor::JoinHostPort(&tmp_out, host_with_scope, port);
            raptor::Free(host_with_scope);
        } else {
            ret = raptor::JoinHostPort(&tmp_out, ntop_buf, port);
        }
        *out = tmp_out.release();
    } else {
        ret = raptor_asprintf(out, "(sockaddr family=%d)", addr->sa_family);
    }
    /* This is probably redundant, but we wouldn't want to log the wrong error. */
    errno = save_errno;
    return ret;
}